

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O3

int wirelength(Tree t)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  Branch *pBVar6;
  int iVar7;
  int iVar8;
  
  pBVar6 = t.branch;
  iVar7 = 0;
  if (1 < t.deg) {
    uVar3 = t.deg * 2 - 2;
    uVar4 = 1;
    if (1 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    lVar5 = 0;
    iVar7 = 0;
    do {
      iVar1 = *(int *)((long)&pBVar6->n + lVar5);
      iVar8 = *(int *)((long)&pBVar6->x + lVar5) - pBVar6[iVar1].x;
      iVar2 = -iVar8;
      if (0 < iVar8) {
        iVar2 = iVar8;
      }
      iVar8 = *(int *)((long)&pBVar6->y + lVar5) - pBVar6[iVar1].y;
      iVar1 = -iVar8;
      if (0 < iVar8) {
        iVar1 = iVar8;
      }
      iVar7 = iVar2 + iVar7 + iVar1;
      lVar5 = lVar5 + 0xc;
    } while (uVar4 * 0xc != lVar5);
  }
  return iVar7;
}

Assistant:

DTYPE wirelength(Tree t)
{
    int i, j;
    DTYPE l=0;

    for (i=0; i<2*t.deg-2; i++) {
        j = t.branch[i].n;
        l += ADIFF(t.branch[i].x, t.branch[j].x)
            + ADIFF(t.branch[i].y, t.branch[j].y);
    }

    return l;
}